

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O2

uint8_t * bstr_match_bstr(uint8_t *pBegin,uint8_t *pEnd,uint8_t *pStrBegin,uint8_t *pStrEnd)

{
  int *piVar1;
  long lVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  
  if (pStrEnd < pStrBegin || pEnd < pBegin) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
LAB_001380d2:
    puVar3 = (uint8_t *)0x0;
  }
  else {
    puVar3 = pStrBegin + ((long)pEnd - (long)pBegin);
    lVar2 = (long)pStrEnd - (long)pStrBegin;
    for (puVar4 = pBegin; puVar4 < pEnd; puVar4 = puVar4 + 1) {
      if (pStrEnd <= pStrBegin) {
        return pBegin + lVar2;
      }
      if (*puVar4 != *pStrBegin) goto LAB_001380d2;
      pStrBegin = pStrBegin + 1;
    }
    lVar2 = 0;
    if (puVar3 == pStrEnd) {
      lVar2 = (long)pEnd - (long)pBegin;
    }
    puVar3 = pBegin + lVar2;
  }
  return puVar3;
}

Assistant:

const uint8_t *bstr_match_bstr(const uint8_t *pBegin, const uint8_t *pEnd, const uint8_t *pStrBegin, const uint8_t *pStrEnd)
{
   const uint8_t *pNext = pBegin;
   const uint8_t *pStrNext = pStrBegin;
   if ( (pBegin > pEnd) || (pStrBegin > pStrEnd) )
   {
      errno = EINVAL; //invalid arguments
      return 0;
   }
   while(pNext < pEnd){
      if (pStrNext < pStrEnd)
      {
         if (*pNext != *pStrNext)
         {
            return 0; //string did not match
         }
      }
      else
      {
         //All characters in pStr has been successfully matched
         return pNext; //pNext should point to pStrEnd at this point
      }
      pNext++;
      pStrNext++;
   }
   if (pStrNext == pStrEnd)
   {
      return pNext; //All characters in pStr has been successfully matched
   }
   return pBegin; //reached pEnd before pStr was fully matched
}